

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_ecdsa_adaptor.cpp
# Opt level: O0

void __thiscall
AdaptorSignature_Verify_Test::AdaptorSignature_Verify_Test(AdaptorSignature_Verify_Test *this)

{
  AdaptorSignature_Verify_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__AdaptorSignature_Verify_Test_009ebc70;
  return;
}

Assistant:

TEST(AdaptorSignature, Verify) {
  AdaptorSignature adaptor_sig("03424d14a5471c048ab87b3b83f6085d125d5864249ae4297a57c84e74710bb6730223f325042fce535d040fee52ec13231bf709ccd84233c6944b90317e62528b2527dff9d659a96db4c99f9750168308633c1867b70f3a18fb0f4539a1aecedcd1fc0148fc22f36b6303083ece3f872b18e35d368b3958efe5fb081f7716736ccb598d269aa3084d57e1855e1ea9a45efc10463bbf32ae378029f5763ceb40173f");  // NOLINT

  EXPECT_TRUE(
      adaptor_sig.Verify(
          ByteData256("8131e6f4b45754f2c90bd06688ceeabc0c45055460729928b4eecf11026a9e2d"),  // NOLINT
          Pubkey("035be5e9478209674a96e60f1f037f6176540fd001fa1d64694770c56a7709c42c"),  // NOLINT
          Pubkey("02c2662c97488b07b6e819124b8989849206334a4c2fbdf691f7b34d2b16e9c293")));  // NOLINT
}